

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

void __thiscall
Js::DynamicObject::DynamicObject(DynamicObject *this,DynamicType *type,bool initSlots)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint uVar4;
  DynamicTypeHandler *pDVar5;
  undefined4 *puVar6;
  nullptr_t local_30;
  nullptr_t local_28;
  byte local_19;
  DynamicType *pDStack_18;
  bool initSlots_local;
  DynamicType *type_local;
  DynamicObject *this_local;
  
  local_19 = initSlots;
  pDStack_18 = type;
  type_local = (DynamicType *)this;
  RecyclableObject::RecyclableObject(&this->super_RecyclableObject,&type->super_Type);
  (this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e46ac0;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&this->auxSlots,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ArrayObject>::WriteBarrierPtr(&(this->field_1).objectArray,&local_30);
  bVar2 = UsesObjectArrayOrFlagsAsFlags(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x11,"(!UsesObjectArrayOrFlagsAsFlags())",
                                "!UsesObjectArrayOrFlagsAsFlags()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((local_19 & 1) == 0) {
    pDVar5 = DynamicType::GetTypeHandler(pDStack_18);
    uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar5);
    pDVar5 = DynamicType::GetTypeHandler(pDStack_18);
    uVar4 = DynamicTypeHandler::GetSlotCapacity(pDVar5);
    if (uVar3 != uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x18,
                                  "(type->GetTypeHandler()->GetInlineSlotCapacity() == type->GetTypeHandler()->GetSlotCapacity())"
                                  ,
                                  "type->GetTypeHandler()->GetInlineSlotCapacity() == type->GetTypeHandler()->GetSlotCapacity()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  else {
    InitSlots(this,this);
  }
  return;
}

Assistant:

DynamicObject::DynamicObject(DynamicType * type, const bool initSlots) :
        RecyclableObject(type),
        auxSlots(nullptr),
        objectArray(nullptr)
    {
        Assert(!UsesObjectArrayOrFlagsAsFlags());
        if (initSlots)
        {
            InitSlots(this);
        }
        else
        {
            Assert(type->GetTypeHandler()->GetInlineSlotCapacity() == type->GetTypeHandler()->GetSlotCapacity());
        }

#if ENABLE_OBJECT_SOURCE_TRACKING
        TTD::InitializeDiagnosticOriginInformation(this->TTDDiagOriginInfo);
#endif
    }